

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

int __thiscall QTabBarPrivate::indexAtPos(QTabBarPrivate *this,QPoint *p)

{
  QTabBar *this_00;
  char cVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBar **)&(this->super_QWidgetPrivate).field_0x8;
  local_48 = QTabBar::tabRect(this_00,this->currentIndex);
  cVar1 = QRect::contains((QPoint *)&local_48,SUB81(p,0));
  if (cVar1 == '\0') {
    uVar2 = (this->tabList).d.size;
    iVar3 = -1;
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        if (((this->tabList).d.ptr[uVar4]->field_0xe4 & 1) != 0) {
          local_48 = QTabBar::tabRect(this_00,(int)uVar4);
          cVar1 = QRect::contains((QPoint *)&local_48,SUB81(p,0));
          iVar3 = (int)uVar4;
          if (cVar1 != '\0') break;
          uVar2 = (this->tabList).d.size;
        }
        uVar4 = uVar4 + 1;
        iVar3 = -1;
      } while (uVar4 < uVar2);
    }
  }
  else {
    iVar3 = this->currentIndex;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QTabBarPrivate::indexAtPos(const QPoint &p) const
{
    Q_Q(const QTabBar);
    if (q->tabRect(currentIndex).contains(p))
        return currentIndex;
    for (int i = 0; i < tabList.size(); ++i)
        if (tabList.at(i)->enabled && q->tabRect(i).contains(p))
            return i;
    return -1;
}